

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

TestResult *
test_one<short>(TestResult *__return_storage_ptr__,random_numerators<short> *vals,short denom)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  bool bVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  uint64_t actual;
  pFuncToTime<short,_short> extraout_RDX;
  ushort uVar10;
  divider<short,_(libdivide::Branching)0> denom_00;
  divider<short,_(libdivide::Branching)1> denom_01;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_XMM5 [16];
  time_double tVar17;
  time_double tVar18;
  time_double tVar19;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  undefined1 local_78 [16];
  timer t;
  pFuncToTime<short,_short> timeFunc;
  
  if (denom == 0) {
    fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x4fb,"libdivide_internal_s16_gen",
            "divider must be != 0");
    abort();
  }
  uVar10 = -denom;
  if (0 < denom) {
    uVar10 = denom;
  }
  uVar5 = (ushort)LZCOUNT(uVar10) ^ 0xf;
  if ((uVar10 - 1 & uVar10) == 0) {
    uVar5 = uVar5 | (byte)((ushort)denom >> 8) & 0x80;
    uVar3 = 0;
  }
  else {
    uVar2 = (uint)(0x8000 << uVar5) / (uint)uVar10;
    iVar8 = uVar2 * uVar10;
    if (((uint)uVar10 + iVar8 & 0xffff) >> uVar5 == 0) {
      bVar4 = 0xe - (char)LZCOUNT(uVar10);
    }
    else {
      sVar1 = (short)iVar8;
      bVar4 = (byte)uVar5 | 0x40;
      uVar2 = (uint)(0 < sVar1 || uVar10 <= (ushort)(sVar1 * -2)) + uVar2 * 2;
    }
    uVar3 = ~uVar2;
    if (-1 < denom) {
      uVar3 = uVar2 + 1;
    }
    uVar5 = (uint)(bVar4 | 0x80);
    if (-1 < denom) {
      uVar5 = (uint)bVar4;
    }
  }
  uVar2 = 2;
  if (denom != 1) {
    uVar2 = (uint)(ushort)denom;
  }
  uVar10 = (ushort)uVar2;
  uVar7 = -uVar10;
  if (0 < (short)uVar10) {
    uVar7 = uVar10;
  }
  uVar11 = (ushort)LZCOUNT(uVar7) ^ 0xf;
  uVar9 = uVar7 - 1 & (uint)uVar7;
  timeFunc = (pFuncToTime<short,_short>)(ulong)uVar9;
  if (uVar9 == 0) {
    uVar11 = uVar11 | uVar2 >> 8 & 0x80;
    iVar8 = 0;
  }
  else {
    uVar2 = (uint)(0x8000 << uVar11) / (uint)uVar7;
    sVar1 = uVar7 * (short)uVar2;
    bVar6 = 0 < sVar1 || uVar7 <= (ushort)(sVar1 * -2);
    timeFunc = (pFuncToTime<short,_short>)(ulong)bVar6;
    uVar11 = (uint)(byte)(((-1 < (short)uVar10) << 7 | (byte)uVar11) - 0x40);
    iVar8 = bVar6 + 1 + uVar2 * 2;
  }
  denom_00.div.denom = (dispatcher_t)((int3)uVar5 * 0x10000 + ((uint3)uVar3 & 0xffff));
  denom_01.div.denom = (dispatcher_t)((uint3)iVar8 & 0xffff | (uint3)(uVar11 << 0x10));
  local_78._8_8_ = 0x7fffffffffffffff;
  local_78._0_8_ = 0x7fffffffffffffff;
  lVar12 = 0x1e;
  local_88 = 0x7fffffffffffffff;
  local_98 = 0x7fffffffffffffff;
  local_90 = 0x7fffffffffffffff;
  uVar13 = 0x7fffffffffffffff;
  while (bVar6 = lVar12 != 0, lVar12 = lVar12 + -1, bVar6) {
    tVar17 = time_function<short,short>(vals,denom,timeFunc);
    actual = tVar17.result;
    tVar18 = time_function<short,libdivide::divider<short,(libdivide::Branching)0>>
                       (vals,denom_00,
                        sum_quotients<short,libdivide::divider<short,(libdivide::Branching)0>>);
    check_result(tVar18.result,actual,0xf9);
    if (denom != 1) {
      tVar19 = time_function<short,libdivide::divider<short,(libdivide::Branching)1>>
                         (vals,denom_01,
                          sum_quotients<short,libdivide::divider<short,(libdivide::Branching)1>>);
      if (tVar19.time < local_90) {
        local_90 = tVar19.time;
      }
      check_result(tVar19.result,actual,0xfe);
    }
    tVar19 = time_function<short,libdivide::divider<short,(libdivide::Branching)0>>
                       (vals,denom_00,
                        sum_quotients_vec<short,libdivide::divider<short,(libdivide::Branching)0>>);
    if (tVar19.time < local_88) {
      local_88 = tVar19.time;
    }
    check_result(tVar19.result,actual,0x104);
    if (denom != 1) {
      tVar19 = time_function<short,libdivide::divider<short,(libdivide::Branching)1>>
                         (vals,denom_01,
                          sum_quotients_vec<short,libdivide::divider<short,(libdivide::Branching)1>>
                         );
      if (tVar19.time < local_98) {
        local_98 = tVar19.time;
      }
      check_result(tVar19.result,actual,0x109);
    }
    auVar15._8_8_ = 0;
    auVar15._0_8_ = tVar18.time;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = tVar17.time;
    auVar15 = vpunpcklqdq_avx(auVar14,auVar15);
    local_78 = vpminuq_avx512vl(auVar15,local_78);
    timer::start(&t);
    generate_divisor<short>(vals,denom);
    timer::stop(&t);
    auVar15 = vpsubq_avx((undefined1  [16])t.end_time,(undefined1  [16])t.start_time);
    auVar14 = vpmullq_avx512vl(auVar15,_DAT_00106020);
    auVar15 = vpshufd_avx(auVar14,0xee);
    auVar15 = vpaddq_avx(auVar15,auVar14);
    timeFunc = extraout_RDX;
    if (auVar15._0_8_ < uVar13) {
      uVar13 = auVar15._0_8_;
    }
  }
  auVar15 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,vals->_length);
  bVar6 = denom == 1;
  auVar16._0_8_ = auVar15._0_8_;
  __return_storage_ptr__->gen_time = (double)(long)uVar13 / auVar16._0_8_;
  auVar15 = vcvtuqq2pd_avx512vl(local_78);
  auVar14 = vcvtusi2sd_avx512f(in_XMM5,local_88);
  __return_storage_ptr__->branchfree_time =
       (double)((ulong)bVar6 * -0x4010000000000000 +
               (ulong)!bVar6 * (long)((double)(long)local_90 / auVar16._0_8_));
  auVar16._8_8_ = auVar16._0_8_;
  auVar15 = vdivpd_avx(auVar15,auVar16);
  __return_storage_ptr__->vector_time = auVar14._0_8_ / auVar16._0_8_;
  __return_storage_ptr__->vector_branchfree_time =
       (double)((ulong)bVar6 * -0x4010000000000000 +
               (ulong)!bVar6 * (long)((double)(long)local_98 / auVar16._0_8_));
  __return_storage_ptr__->hardware_time = (double)auVar15._0_8_;
  __return_storage_ptr__->base_time = (double)auVar15._8_8_;
  return __return_storage_ptr__;
}

Assistant:

NOINLINE TestResult test_one(const random_numerators<IntT> &vals, IntT denom) {
    const bool testBranchfree = (denom != 1);
    divider<IntT, BRANCHFULL> div_bfull(denom);
    divider<IntT, BRANCHFREE> div_bfree(testBranchfree ? denom : 2);

    uint64_t min_my_time = INT64_MAX, min_my_time_branchfree = INT64_MAX,
             min_my_time_vector = INT64_MAX, min_my_time_vector_branchfree = INT64_MAX,
             min_his_time = INT64_MAX, min_gen_time = INT64_MAX;
    time_double tresult;
    for (size_t iter = 0; iter < TEST_COUNT; iter++) {
        tresult = time_function(vals, denom, sum_quotients);
        min_his_time = (std::min)(min_his_time, tresult.time);
        const uint64_t expected = tresult.result;

        tresult = time_function(vals, div_bfull, sum_quotients);
        min_my_time = (std::min)(min_my_time, tresult.time);
        check_result(tresult.result, expected, __LINE__);

        if (testBranchfree) {
            tresult = time_function(vals, div_bfree, sum_quotients);
            min_my_time_branchfree = (std::min)(min_my_time_branchfree, tresult.time);
            check_result(tresult.result, expected, __LINE__);
        }

#if defined(x86_VECTOR_TYPE) || defined(LIBDIVIDE_NEON)
        tresult = time_function(vals, div_bfull, sum_quotients_vec);
        min_my_time_vector = (std::min)(min_my_time_vector, tresult.time);
        check_result(tresult.result, expected, __LINE__);

        if (testBranchfree) {
            tresult = time_function(vals, div_bfree, sum_quotients_vec);
            min_my_time_vector_branchfree = (std::min)(min_my_time_vector_branchfree, tresult.time);
            check_result(tresult.result, expected, __LINE__);
        }
#else
        min_my_time_vector = 0;
        min_my_time_vector_branchfree = 0;
#endif

        {
            timer t;
            t.start();
            generate_divisor(vals, denom);
            t.stop();
            min_gen_time = (std::min)(min_gen_time, t.duration_nano());
        }
    }

    TestResult result;
    result.gen_time = min_gen_time / (double)vals.length();
    result.base_time = min_my_time / (double)vals.length();
    result.branchfree_time = testBranchfree ? min_my_time_branchfree / (double)vals.length() : -1;
    result.vector_time = min_my_time_vector / (double)vals.length();
    result.vector_branchfree_time =
        testBranchfree ? min_my_time_vector_branchfree / (double)vals.length() : -1;
    result.hardware_time = min_his_time / (double)vals.length();
    return result;
}